

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O3

void anon_unknown.dwarf_5f7ee::equals_msg(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string expected;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Assert local_60 [3];
  
  local_60[0].m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_60[0].m_line = 0x53;
  paVar1 = &local_c0[0].field_2;
  local_c0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Message","");
  local_e0.field_2._M_allocated_capacity._0_4_ = 0x6c6c6548;
  local_e0.field_2._M_allocated_capacity._4_2_ = 0x6f;
  local_e0._M_string_length = 5;
  local_80.field_2._M_allocated_capacity._0_4_ = 0x6c726f57;
  local_80.field_2._M_allocated_capacity._4_2_ = 100;
  local_80._M_string_length = 5;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  UnitTests::Assert::Equals<std::__cxx11::string,std::__cxx11::string>
            (local_60,local_c0,&local_e0,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT26(local_80.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_80.field_2._M_allocated_capacity._4_2_,
                                      local_80.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,
                    CONCAT26(local_e0.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_e0.field_2._M_allocated_capacity._4_2_,
                                      local_e0.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0[0]._M_dataplus._M_p,local_c0[0].field_2._M_allocated_capacity + 1);
  }
  local_e0._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  local_e0._M_string_length = CONCAT44(local_e0._M_string_length._4_4_,0x54);
  local_c0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"ASSERT_EQUALS should have fired here.","");
  UnitTests::Assert::Fail((Assert *)&local_e0,local_c0);
}

Assistant:

TEST(assert_true1)
    {
        try
        {
            ASSERT_TRUE(1 == 2);
            FAIL("ASSERT_TRUE should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg      = e.what();
            std::string expected = "error A1000: Assertion failure :  Expression evaluated to false";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_TRUE", __FILE__, __LINE__);
            }
        }
    }